

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void * cmAddSource(void *arg,void *arg2)

{
  _Rb_tree_header *p_Var1;
  value_type *pvVar2;
  cmSourceFile *pcVar3;
  mapped_type pcVar4;
  mapped_type *ppcVar5;
  string *d;
  value_type *__x;
  cmSourceFile *rsf;
  cmSourceFile *local_38;
  
  if (*(long *)((long)arg2 + 0x50) == 0) {
    pcVar4 = (mapped_type)0x0;
  }
  else {
    pcVar3 = cmMakefile::GetOrCreateSource
                       ((cmMakefile *)arg,(string *)((long)arg2 + 0x48),false,Ambiguous);
    local_38 = pcVar3;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                 *)&pcVar3->Properties,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                 *)((long)arg2 + 0x80));
    __x = *(value_type **)((long)arg2 + 0x68);
    pvVar2 = *(value_type **)((long)arg2 + 0x70);
    if (__x != pvVar2) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar3->Depends,__x);
        __x = __x + 1;
      } while (__x != pvVar2);
    }
    pcVar4 = (mapped_type)operator_new(0xb0);
    (pcVar4->SourceName)._M_dataplus._M_p = (pointer)&(pcVar4->SourceName).field_2;
    (pcVar4->SourceName)._M_string_length = 0;
    (pcVar4->SourceName).field_2._M_local_buf[0] = '\0';
    (pcVar4->SourceExtension)._M_dataplus._M_p = (pointer)&(pcVar4->SourceExtension).field_2;
    (pcVar4->SourceExtension)._M_string_length = 0;
    (pcVar4->SourceExtension).field_2._M_local_buf[0] = '\0';
    (pcVar4->FullPath)._M_dataplus._M_p = (pointer)&(pcVar4->FullPath).field_2;
    (pcVar4->FullPath)._M_string_length = 0;
    (pcVar4->FullPath).field_2._M_local_buf[0] = '\0';
    (pcVar4->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pcVar4->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pcVar4->Depends).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var1 = &(pcVar4->Properties).
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pcVar4->Properties).
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pcVar4->Properties).
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pcVar4->Properties).
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pcVar4->Properties).
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pcVar4->Properties).
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar4->RealSourceFile = pcVar3;
    std::__cxx11::string::_M_assign((string *)&pcVar4->FullPath);
    std::__cxx11::string::_M_assign((string *)&pcVar4->SourceName);
    std::__cxx11::string::_M_assign((string *)&pcVar4->SourceExtension);
    ppcVar5 = std::
              map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
              ::operator[](&cmCPluginAPISourceFiles.
                            super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                           ,&local_38);
    *ppcVar5 = pcVar4;
  }
  return pcVar4;
}

Assistant:

void* CCONV cmAddSource(void* arg, void* arg2)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmCPluginAPISourceFile* osf = static_cast<cmCPluginAPISourceFile*>(arg2);
  if (osf->FullPath.empty()) {
    return nullptr;
  }

  // Create the real cmSourceFile instance and copy over saved information.
  cmSourceFile* rsf = mf->GetOrCreateSource(osf->FullPath);
  rsf->GetProperties() = osf->Properties;
  for (std::string const& d : osf->Depends) {
    rsf->AddDepend(d);
  }

  // Create the proxy for the real source file.
  cmCPluginAPISourceFile* sf = new cmCPluginAPISourceFile;
  sf->RealSourceFile = rsf;
  sf->FullPath = osf->FullPath;
  sf->SourceName = osf->SourceName;
  sf->SourceExtension = osf->SourceExtension;

  // Store the proxy in the map so it can be re-used and deleted later.
  cmCPluginAPISourceFiles[rsf] = sf;
  return sf;
}